

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

int __thiscall libtorrent::aux::torrent::init(torrent *this,EVP_PKEY_CTX *ctx)

{
  shared_ptr<libtorrent::torrent_info> *__r;
  undefined1 *puVar1;
  vector<download_priority_t,_file_index_t> *this_00;
  uchar uVar2;
  download_priority_t new_piece_priority;
  int iVar3;
  uint uVar4;
  element_type *this_01;
  add_torrent_params *paVar5;
  element_type *this_02;
  pointer pppVar6;
  session_interface *psVar7;
  file_storage *this_03;
  pointer pcVar8;
  libtorrent *this_04;
  error_code_enum e;
  size_type sVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  file_index_t fVar20;
  file_index_t fVar21;
  int extraout_EAX;
  _Base_ptr p_Var22;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar23;
  int64_t iVar24;
  ulong uVar25;
  undefined4 extraout_var;
  _Alloc_hider _Var26;
  pointer pppVar27;
  long lVar28;
  element_type *peVar29;
  piece_index_t piece;
  EVP_PKEY_CTX *__r_00;
  size_type __new_size;
  char *in_R9;
  pointer psVar30;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar31;
  piece_index_t pVar32;
  long lVar33;
  element_type *peVar34;
  string_view sVar35;
  string_view lhs;
  peer_request pVar36;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_1f0;
  undefined1 local_1d8 [16];
  string local_1c8;
  vector<std::string,_file_index_t> links;
  shared_ptr<libtorrent::aux::torrent> t;
  undefined1 local_168 [64];
  shared_ptr<libtorrent::aux::peer_connection> pc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  pointer local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  _Any_data local_68;
  code *local_58;
  target_fns *ptStack_50;
  __shared_ptr<libtorrent::torrent_info_const,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  __r = &(this->super_torrent_hot_members).m_torrent_file;
  (*(this->super_request_callback)._vptr_request_callback[7])
            (this,"init torrent: %s",
             (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_name._M_dataplus._M_p);
  this_00 = &this->m_file_priority;
  iVar19 = *(int *)&(this->m_file_priority).
                    super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    .
                    super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = *(int *)&(this->m_file_priority).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  iVar18 = file_storage::num_files
                     (&((this->super_torrent_hot_members).m_torrent_file.
                        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->m_files);
  if (iVar18 < iVar19 - iVar3) {
    iVar19 = file_storage::num_files
                       (&((__r->
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_files);
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                        *)this_00,iVar19);
  }
  else if (((((this->m_add_torrent_params)._M_t.
              super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
              ._M_t.
              super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
              .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl)->flags).
            m_val & 0x800000) != 0) {
    iVar19 = file_storage::num_files
                       (&((__r->
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_files);
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                        *)this_00,iVar19,
                       (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                       &dont_download);
  }
  sVar35 = torrent_info::ssl_cert
                     ((__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr);
  if (sVar35._M_len != 0) {
    this->field_0x5e0 = this->field_0x5e0 | 2;
    init_ssl(this,sVar35);
  }
  this_01 = (__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar19 = (this_01->m_files).m_num_pieces;
  if (iVar19 == 0) {
    e = torrent_invalid_length;
LAB_002cff46:
    boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
              ((error_code *)&pc,e,(type *)0x0);
    set_error(this,(error_code *)&pc,(file_index_t)0xffffffff);
    iVar19 = pause(this);
    return iVar19;
  }
  if (iVar19 == 0x7fffffff) {
    e = too_many_pieces_in_torrent;
    goto LAB_002cff46;
  }
  if (0x1fffc000 < (this_01->m_files).m_piece_length) {
    e = invalid_piece_size;
    goto LAB_002cff46;
  }
  paVar5 = (this->m_add_torrent_params)._M_t.
           super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
           .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
  if (paVar5 != (add_torrent_params *)0x0) {
    for (p_Var22 = (paVar5->renamed_files).
                   super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var22 !=
        &(paVar5->renamed_files).
         super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_t._M_impl.super__Rb_tree_header;
        p_Var22 = (_Base_ptr)::std::_Rb_tree_increment(p_Var22)) {
      if (-1 < (int)p_Var22[1]._M_color) {
        fVar20 = file_storage::end_file(&this_01->m_files);
        if ((int)p_Var22[1]._M_color < fVar20.m_val) {
          torrent_info::rename_file
                    ((__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)
                     ._M_ptr,(file_index_t)p_Var22[1]._M_color,(string *)&p_Var22[1]._M_parent);
        }
      }
    }
  }
  construct_storage(this);
  uVar25 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  if ((((uint)uVar25 >> 0x1d & 1) != 0) &&
     (this_02 = (__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr, 0 < (this_02->m_files).m_piece_length)) {
    psVar30 = (this->m_file_priority).
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              .
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_file_priority).
        super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        .
        super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar30) {
      (this->m_file_priority).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = psVar30;
    }
    iVar19 = file_storage::num_files(&this_02->m_files);
    container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
    ::resize<int,void>((container_wrapper<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>,std::allocator<libtorrent::aux::strong_typedef<unsigned_char,libtorrent::download_priority_tag,void>>>>
                        *)this_00,iVar19,
                       (strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void> *)
                       &dont_download);
    uVar25 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
  }
  if (((uint)uVar25 >> 0x19 & 1) == 0) {
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 = uVar25 | 0x2000000;
    pppVar6 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pppVar27 = (this->super_torrent_hot_members).m_connections.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; pppVar27 != pppVar6;
        pppVar27 = pppVar27 + 1) {
      __r_00 = (EVP_PKEY_CTX *)
               &(*pppVar27)->super_enable_shared_from_this<libtorrent::aux::peer_connection>;
      ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<libtorrent::aux::peer_connection,void>
                ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&pc,
                 (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)__r_00)
      ;
      iVar19 = (*((pc.
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
      if ((char)iVar19 == '\0') {
        peer_connection::on_metadata_impl
                  (pc.
                   super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        iVar19 = (*((pc.
                     super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->super_bandwidth_socket)._vptr_bandwidth_socket[1])();
        if ((char)iVar19 == '\0') {
          peer_connection::init
                    (pc.
                     super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,__r_00);
        }
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pc.
                  super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  if ((this->m_file_priority).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_file_priority).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = (this->m_need_save_resume_data).m_val;
    update_piece_priorities(this,this_00);
    (this->m_need_save_resume_data).m_val = uVar2;
  }
  paVar5 = (this->m_add_torrent_params)._M_t.
           super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
           .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
  if (paVar5 != (add_torrent_params *)0x0) {
    lVar28 = *(long *)&(paVar5->piece_priorities).
                       super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                       ._M_impl;
    psVar30 = (paVar5->piece_priorities).
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    __new_size = (size_type)
                 (((__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->m_files).m_num_pieces;
    if (__new_size < (ulong)((long)psVar30 - lVar28)) {
      ::std::
      vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ::resize(&paVar5->piece_priorities,__new_size);
      paVar5 = (this->m_add_torrent_params)._M_t.
               super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
               ._M_t.
               super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
               .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
      lVar28 = *(long *)&(paVar5->piece_priorities).
                         super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                         ._M_impl;
      psVar30 = (paVar5->piece_priorities).
                super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (lVar33 = 0; (pointer)(lVar28 + lVar33) != psVar30; lVar33 = lVar33 + 1) {
      new_piece_priority.m_val = ((pointer)(lVar28 + lVar33))->m_val;
      if (((this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl !=
           (piece_picker *)0x0) || (new_piece_priority.m_val != '\x04')) {
        need_picker(this);
        piece_picker::set_piece_priority
                  ((this->super_torrent_hot_members).m_picker._M_t.
                   super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                   .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                   (piece_index_t)(int)lVar33,new_piece_priority);
      }
    }
    update_gauge(this);
  }
  if ((this->field_0x5cc & 4) == 0) {
    need_picker(this);
    this->m_padding_bytes = 0;
    pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    iVar23 = file_storage::file_range(&this_01->m_files);
    iVar31 = iVar23;
    while( true ) {
      _Var10._M_pi = pc.
                     super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
      local_1f0 = iVar23._end.m_val;
      fVar20.m_val = (int)iVar31._begin.m_val;
      peVar29 = pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (fVar20.m_val == local_1f0.m_val) break;
      bVar17 = file_storage::pad_file_at(&this_01->m_files,fVar20);
      if ((bVar17) && (iVar24 = file_storage::file_size(&this_01->m_files,fVar20), iVar24 != 0)) {
        iVar24 = file_storage::file_size(&this_01->m_files,fVar20);
        pVar36 = file_storage::map_file(&this_01->m_files,fVar20,iVar24 + -1,0);
        uVar25 = pVar36._0_8_;
        if (((pVar36.start + 1) % (this_01->m_files).m_piece_length == 0) ||
           (fVar21 = file_storage::end_file(&this_01->m_files), fVar21.m_val + -1 <= fVar20.m_val))
        {
          for (iVar24 = file_storage::file_size(&this_01->m_files,fVar20); 0 < iVar24;
              iVar24 = iVar24 - lVar28) {
            pVar32.m_val = (int)uVar25;
            iVar19 = file_storage::piece_size(&this_01->m_files,pVar32);
            lVar28 = (long)iVar19;
            if (iVar24 < iVar19) {
              lVar28 = iVar24;
            }
            local_168._0_4_ = pVar32.m_val;
            this->m_padding_bytes = this->m_padding_bytes + lVar28;
            iVar19 = file_storage::piece_size(&this_01->m_files,pVar32);
            piece.m_val = pVar32.m_val;
            if (iVar19 == (int)lVar28) {
              ::std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
              ::push_back((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                           *)&pc,(value_type *)local_168);
              piece.m_val = local_168._0_4_;
            }
            piece_picker::set_pad_bytes
                      ((this->super_torrent_hot_members).m_picker._M_t.
                       super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                       .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                       piece,(int)lVar28);
            uVar25 = (ulong)(pVar32.m_val - 1);
          }
        }
      }
      iVar31._begin.m_val = fVar20.m_val + 1;
      iVar31._end.m_val = 0;
    }
    for (; peVar29 != (element_type *)_Var10._M_pi;
        peVar29 = (element_type *)
                  ((long)&(peVar29->super_bandwidth_socket)._vptr_bandwidth_socket + 4)) {
      pVar32.m_val = *(int *)&(peVar29->super_bandwidth_socket)._vptr_bandwidth_socket;
      bVar17 = piece_picker::have_piece
                         ((this->super_torrent_hot_members).m_picker._M_t.
                          super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                          .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                          _M_head_impl,pVar32);
      if (!bVar17) {
        we_have(this,pVar32,false);
      }
    }
    ::std::
    _Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
    ::~_Vector_base((_Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                     *)&pc);
  }
  else {
    puVar1 = &(this->super_torrent_hot_members).field_0x4b;
    *puVar1 = *puVar1 | 0x40;
    update_gauge(this);
    update_state_list(this);
    update_want_tick(this);
  }
  set_state(this,checking_resume_data);
  links.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  links.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  links.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  torrent_info::similar_torrents
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)&pc
             ,(this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)
      pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi) {
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_168,
               (__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    uVar12 = local_168._8_8_;
    uVar11 = local_168._0_8_;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_168);
    ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
    ~_Vector_base((_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   *)&pc);
    if (uVar11 == uVar12) goto LAB_002d06ca;
  }
  else {
    ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
    ~_Vector_base((_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                   *)&pc);
  }
  ::std::__shared_ptr<libtorrent::torrent_info_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::torrent_info,void>
            (local_40,&__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
            );
  resolve_links::resolve_links
            ((resolve_links *)&pc,(shared_ptr<const_libtorrent::torrent_info> *)local_40);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  torrent_info::similar_torrents
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             (local_1d8 + 0x10),
             (__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  sVar9 = local_1c8._M_string_length;
  for (_Var26._M_p = local_1c8._M_dataplus._M_p; _Var26._M_p != (pointer)sVar9;
      _Var26._M_p = _Var26._M_p + 0x14) {
    psVar7 = (this->super_torrent_hot_members).m_ses;
    local_168._0_8_ = *(undefined8 *)_Var26._M_p;
    local_168._8_8_ = *(vector<aux::merkle_tree,_file_index_t> **)((long)_Var26._M_p + 8);
    local_168._16_4_ =
         *(undefined4 *)
          &(((vector<aux::vector<piece_hash_request>,_file_index_t> *)((long)_Var26._M_p + 0x10))->
           super_vector<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
           ).
           super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    digest32<256L>::clear((digest32<256L> *)(local_168 + 0x14));
    (*(psVar7->super_session_logger)._vptr_session_logger[0x16])
              ((torrent *)local_1d8,psVar7,(string *)local_168);
    ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
               (torrent *)local_1d8);
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
    if ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) &&
       (bVar17 = is_seed(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr), bVar17)) {
      get_torrent_file((torrent *)local_1d8);
      ::std::__cxx11::string::string
                ((string *)local_168,
                 (string *)
                 &(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->m_save_path);
      resolve_links::match
                ((resolve_links *)&pc,(shared_ptr<const_libtorrent::torrent_info> *)local_1d8,
                 (string *)local_168);
      ::std::__cxx11::string::~string((string *)local_168);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
  ~_Vector_base((_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 *)(local_1d8 + 0x10));
  torrent_info::collections_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_1d8 + 0x10),
             (__r->super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
  ;
  sVar9 = local_1c8._M_string_length;
  for (_Var26._M_p = local_1c8._M_dataplus._M_p; _Var26._M_p != (pointer)sVar9;
      _Var26._M_p = (pointer)&(((hash_picker *)_Var26._M_p)->m_piece_hash_requested).
                              super_vector<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                              .
                              super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x27])
              (&t);
    _Var10 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    for (peVar34 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ; peVar34 != (element_type *)_Var10._M_pi;
        peVar34 = (element_type *)&(peVar34->super_torrent_hot_members).m_hash_picker) {
      bVar17 = is_seed((torrent *)(peVar34->super_request_callback)._vptr_request_callback);
      if (bVar17) {
        get_torrent_file((torrent *)local_1d8);
        ::std::__cxx11::string::string
                  ((string *)local_168,
                   (string *)((peVar34->super_request_callback)._vptr_request_callback + 0x78));
        resolve_links::match
                  ((resolve_links *)&pc,(shared_ptr<const_libtorrent::torrent_info> *)local_1d8,
                   (string *)local_168);
        ::std::__cxx11::string::~string((string *)local_168);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d8 + 8));
      }
    }
    ::std::
    vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
    ::~vector((vector<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
               *)&t);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_1d8 + 0x10));
  if ((pointer)local_118._M_pi != local_110) {
    iVar19 = file_storage::num_files
                       (&((__r->
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_files);
    container_wrapper<std::__cxx11::string,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::resize<int,void>((container_wrapper<std::__cxx11::string,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&links,iVar19);
    for (; (pointer)local_118._M_pi != local_110; local_118._M_pi = local_118._M_pi + 0x38) {
      this_03 = *(file_storage **)
                 ((array<unsigned_int,_5UL> *)&((pointer)local_118._M_pi)->ti)->_M_elems;
      if (this_03 != (file_storage *)0x0) {
        pcVar8 = (((pointer)local_118._M_pi)->save_path)._M_dataplus._M_p;
        this_04 = (libtorrent *)(((pointer)local_118._M_pi)->save_path)._M_string_length;
        fVar20.m_val = (((pointer)local_118._M_pi)->file_idx).m_val;
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&t,"",(allocator<char> *)local_1d8);
        file_storage::file_path((string *)(local_1d8 + 0x10),this_03,fVar20,(string *)&t);
        sVar35._M_str = in_R9;
        sVar35._M_len = (size_t)local_1c8._M_dataplus._M_p;
        lhs._M_str = (char *)local_1c8._M_string_length;
        lhs._M_len = (size_t)pcVar8;
        combine_path_abi_cxx11_((string *)local_168,this_04,lhs,sVar35);
        ::std::__cxx11::string::operator=
                  ((string *)
                   (links.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                   (((pointer)local_118._M_pi)->file_idx).m_val),(string *)local_168);
        ::std::__cxx11::string::~string((string *)local_168);
        ::std::__cxx11::string::~string((string *)(local_1d8 + 0x10));
        ::std::__cxx11::string::~string((string *)&t);
      }
    }
  }
  resolve_links::~resolve_links((resolve_links *)&pc);
LAB_002d06ca:
  paVar5 = (this->m_add_torrent_params)._M_t.
           super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
           .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
  if ((paVar5 == (add_torrent_params *)0x0) || (((paVar5->flags).m_val & 0x400000) == 0)) {
    iVar19 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[4])();
    uVar4 = (this->m_storage).m_idx.m_val;
    paVar5 = (this->m_add_torrent_params)._M_t.
             super___uniq_ptr_impl<libtorrent::add_torrent_params,_std::default_delete<libtorrent::add_torrent_params>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::add_torrent_params_*,_std::default_delete<libtorrent::add_torrent_params>_>
             .super__Head_base<0UL,_libtorrent::add_torrent_params_*,_false>._M_head_impl;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         links.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         links.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_88.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         links.
         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    links.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    links.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    links.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&pc,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    local_58 = (code *)0x0;
    ptStack_50 = (target_fns *)0x0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = (object_fns *)0x0;
    local_68._M_unused._M_object = operator_new(0x10);
    uVar13 = pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr._0_4_;
    uVar14 = pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr._4_4_;
    uVar15 = pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._0_4_;
    uVar16 = pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._4_4_;
    pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    *(undefined4 *)local_68._M_unused._0_8_ = uVar13;
    *(undefined4 *)((long)local_68._M_unused._0_8_ + 4) = uVar14;
    *(undefined4 *)((long)local_68._M_unused._0_8_ + 8) = uVar15;
    *(undefined4 *)((long)local_68._M_unused._0_8_ + 0xc) = uVar16;
    ptStack_50 = (target_fns *)
                 ::std::
                 _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:1993:25)>
                 ::_M_invoke;
    local_58 = ::std::
               _Function_handler<void_(libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:1993:25)>
               ::_M_manager;
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar19) + 0x40))
              ((long *)CONCAT44(extraout_var,iVar19),uVar4,paVar5,&local_88);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    (*(this->super_request_callback)._vptr_request_callback[7])(this,"init, async_check_files");
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  else {
    pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         ((ulong)pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr & 0xffffff0000000000);
    pc.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            &boost::system::detail::cat_holder<void>::system_category_instance;
    on_resume_data_checked(this,(status_t)0x0,(storage_error *)&pc);
  }
  update_want_peers(this);
  update_want_tick(this);
  maybe_done_flushing(this);
  this->field_0x606 = this->field_0x606 | 0x10;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&links.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  return extraout_EAX;
}

Assistant:

void torrent::init()
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(is_single_thread());

#ifndef TORRENT_DISABLE_LOGGING
		debug_log("init torrent: %s", torrent_file().name().c_str());
#endif

		TORRENT_ASSERT(valid_metadata());
		TORRENT_ASSERT(m_torrent_file->num_files() > 0);
		TORRENT_ASSERT(m_torrent_file->total_size() >= 0);

		if (int(m_file_priority.size()) > m_torrent_file->num_files())
			m_file_priority.resize(m_torrent_file->num_files());
		else if (m_add_torrent_params->flags & torrent_flags::default_dont_download)
			m_file_priority.resize(m_torrent_file->num_files(), dont_download);

		auto cert = m_torrent_file->ssl_cert();
		if (!cert.empty())
		{
			m_ssl_torrent = true;
#ifdef TORRENT_SSL_PEERS
			init_ssl(cert);
#endif
		}

		if (m_torrent_file->num_pieces() > piece_picker::max_pieces)
		{
			set_error(errors::too_many_pieces_in_torrent, torrent_status::error_file_none);
			pause();
			return;
		}

		if (m_torrent_file->num_pieces() == 0)
		{
			set_error(errors::torrent_invalid_length, torrent_status::error_file_none);
			pause();
			return;
		}

		int const blocks_per_piece
			= (m_torrent_file->piece_length() + default_block_size - 1) / default_block_size;
		if (blocks_per_piece > piece_picker::max_blocks_per_piece)
		{
			set_error(errors::invalid_piece_size, torrent_status::error_file_none);
			pause();
			return;
		}

		// --- MAPPED FILES ---
		file_storage const& fs = m_torrent_file->files();
		if (m_add_torrent_params)
		{
			for (auto const& f : m_add_torrent_params->renamed_files)
			{
				if (f.first < file_index_t(0) || f.first >= fs.end_file()) continue;
				m_torrent_file->rename_file(file_index_t(f.first), f.second);
			}
		}

		construct_storage();

#ifndef TORRENT_DISABLE_SHARE_MODE
		if (m_share_mode && valid_metadata())
		{
			// in share mode, all pieces have their priorities initialized to 0
			m_file_priority.clear();
			m_file_priority.resize(m_torrent_file->num_files(), dont_download);
		}
#endif

		// it's important to initialize the peers early, because this is what will
		// fix up their have-bitmasks to have the correct size
		// TODO: 2 add a unit test where we don't have metadata, connect to a peer
		// that sends a bitfield that's too large, then we get the metadata
		if (!m_connections_initialized)
		{
			m_connections_initialized = true;
			// all peer connections have to initialize themselves now that the metadata
			// is available
			// copy the peer list since peers may disconnect and invalidate
			// m_connections as we initialize them
			for (auto* const c : m_connections)
			{
				auto pc = c->self();
				if (pc->is_disconnecting()) continue;
				pc->on_metadata_impl();
				if (pc->is_disconnecting()) continue;
				pc->init();
			}
		}

		// in case file priorities were passed in via the add_torrent_params
		// and also in the case of share mode, we need to update the priorities
		// this has to be applied before piece priority
		if (!m_file_priority.empty())
		{
			// m_file_priority was loaded from the resume data, this doesn't
			// alter any state that needs to be saved in the resume data
			auto const ns = m_need_save_resume_data;
			update_piece_priorities(m_file_priority);
			m_need_save_resume_data = ns;
		}

		if (m_add_torrent_params)
		{
			piece_index_t idx(0);
			if (m_add_torrent_params->piece_priorities.size() > std::size_t(m_torrent_file->num_pieces()))
				m_add_torrent_params->piece_priorities.resize(std::size_t(m_torrent_file->num_pieces()));

			for (auto prio : m_add_torrent_params->piece_priorities)
			{
				if (has_picker() || prio != default_priority)
				{
					need_picker();
					m_picker->set_piece_priority(idx, prio);
				}
				++idx;
			}
			update_gauge();
		}

		if (m_seed_mode)
		{
			m_have_all = true;
			update_gauge();
			update_state_list();
			update_want_tick();
		}
		else
		{
			need_picker();

			TORRENT_ASSERT(block_size() > 0);

			m_padding_bytes = 0;
			std::vector<piece_index_t> have_pieces;

			aux::apply_pad_files(fs, [&](piece_index_t const piece, int const bytes)
			{
				m_padding_bytes += bytes;
				if (bytes == fs.piece_size(piece))
					have_pieces.push_back(piece);
				m_picker->set_pad_bytes(piece, bytes);
			});

			for (auto i : have_pieces)
			{
				// we may have this piece already, if we picked it up from
				// resume data.
				if (m_picker->have_piece(i)) continue;
//				picker().piece_passed(i);
//				TORRENT_ASSERT(picker().have_piece(i));
				we_have(i);
			}
		}

		set_state(torrent_status::checking_resume_data);

		aux::vector<std::string, file_index_t> links;
#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		if (!m_torrent_file->similar_torrents().empty()
			|| !m_torrent_file->collections().empty())
		{
			resolve_links res(m_torrent_file);

			for (auto const& ih : m_torrent_file->similar_torrents())
			{
				std::shared_ptr<torrent> t = m_ses.find_torrent(info_hash_t(ih)).lock();
				if (!t) continue;

				// Only attempt to reuse files from torrents that are seeding.
				// TODO: this could be optimized by looking up which files are
				// complete and just look at those
				if (!t->is_seed()) continue;

				res.match(t->get_torrent_file(), t->save_path());
			}
			for (auto const& c : m_torrent_file->collections())
			{
				std::vector<std::shared_ptr<torrent>> ts = m_ses.find_collection(c);

				for (auto const& t : ts)
				{
					// Only attempt to reuse files from torrents that are seeding.
					// TODO: this could be optimized by looking up which files are
					// complete and just look at those
					if (!t->is_seed()) continue;

					res.match(t->get_torrent_file(), t->save_path());
				}
			}

			std::vector<resolve_links::link_t> const& l = res.get_links();
			if (!l.empty())
			{
				links.resize(m_torrent_file->files().num_files());
				for (auto const& i : l)
				{
					if (!i.ti) continue;
					links[i.file_idx] = combine_path(i.save_path
						, i.ti->files().file_path(i.file_idx));
				}
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

#if TORRENT_USE_ASSERTS
		TORRENT_ASSERT(m_outstanding_check_files == false);
		m_outstanding_check_files = true;
#endif

		if (!m_add_torrent_params || !(m_add_torrent_params->flags & torrent_flags::no_verify_files))
		{
			m_ses.disk_thread().async_check_files(
				m_storage, m_add_torrent_params ? m_add_torrent_params.get() : nullptr
				, std::move(links), [self = shared_from_this()](status_t st, storage_error const& error)
				{ self->on_resume_data_checked(st, error); });
#ifndef TORRENT_DISABLE_LOGGING
			debug_log("init, async_check_files");
#endif
			m_ses.deferred_submit_jobs();
		}
		else
		{
			on_resume_data_checked({}, storage_error{});
		}

		update_want_peers();
		update_want_tick();

		// this will remove the piece picker, if we're done with it
		maybe_done_flushing();

		m_torrent_initialized = true;
	}